

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

Program __thiscall Pass1::run(Pass1 *this,Program *program)

{
  Function *old_function;
  Function *this_00;
  Type *return_type;
  mapped_type *ppFVar1;
  Block *destination_block;
  Block *source_block;
  Function *extraout_RDX;
  Program PVar2;
  Function *new_function;
  undefined1 local_a8 [8];
  FunctionTableKey new_key;
  FunctionTable function_table;
  FileTable file_table;
  Function *main_function;
  Program *program_local;
  Program *new_program;
  
  old_function = Program::get_main_function(program);
  Program::Program((Program *)this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
         *)&function_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::map((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
         *)&new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  FunctionTableKey::FunctionTableKey((FunctionTableKey *)local_a8,old_function);
  this_00 = (Function *)operator_new(0x60);
  return_type = Function::get_return_type(old_function);
  Function::Function(this_00,return_type);
  Program::add_function((Program *)this,this_00);
  ppFVar1 = std::
            map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
            ::operator[]((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
                          *)&new_key.argument_types.
                             super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(key_type *)local_a8);
  *ppFVar1 = this_00;
  destination_block = Function::get_block(this_00);
  source_block = Function::get_block((Function *)local_a8);
  evaluate(program,(Program *)this,
           (FileTable *)&function_table._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (FunctionTable *)
           &new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage,(FunctionTableKey *)local_a8,
           destination_block,source_block);
  FunctionTableKey::~FunctionTableKey((FunctionTableKey *)local_a8);
  std::
  map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::~map((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
          *)&new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
          *)&function_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PVar2.last = extraout_RDX;
  PVar2.first = (Function *)this;
  return PVar2;
}

Assistant:

static Program run(Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FileTable file_table;
		FunctionTable function_table;
		FunctionTableKey new_key(main_function);
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[new_key] = new_function;
		evaluate(&program, &new_program, file_table, function_table, new_key, new_function->get_block(), new_key.old_function->get_block());
		return new_program;
	}